

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_grpc.cpp
# Opt level: O2

void __thiscall
flatbuffers::FlatBufPrinter::Print
          (FlatBufPrinter *this,
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          *vars,char *string_template)

{
  ulong uVar1;
  long lVar2;
  const_iterator cVar3;
  char cVar4;
  string s;
  undefined8 local_70 [4];
  key_type local_50;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_70,string_template,(allocator<char> *)&local_50);
  while( true ) {
    cVar4 = (char)(string *)local_70;
    uVar1 = std::__cxx11::string::find(cVar4,(ulong)(uint)(int)this->escape_char_);
    if (uVar1 == 0xffffffffffffffff) break;
    lVar2 = std::__cxx11::string::find(cVar4,(ulong)(uint)(int)this->escape_char_);
    if (lVar2 == -1) break;
    std::__cxx11::string::substr((ulong)&local_50,(ulong)local_70);
    cVar3 = std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::find(&vars->_M_t,&local_50);
    std::__cxx11::string::~string((string *)&local_50);
    if ((_Rb_tree_header *)cVar3._M_node == &(vars->_M_t)._M_impl.super__Rb_tree_header) break;
    std::__cxx11::string::replace((ulong)local_70,uVar1,(string *)((lVar2 - uVar1) + 1));
  }
  (*(this->super_Printer)._vptr_Printer[3])(this,local_70[0]);
  std::__cxx11::string::~string((string *)local_70);
  return;
}

Assistant:

void Print(const std::map<std::string, std::string> &vars,
             const char *string_template) {
    std::string s = string_template;
    // Replace any occurrences of strings in "vars" that are surrounded
    // by the escape character by what they're mapped to.
    size_t pos;
    while ((pos = s.find(escape_char_)) != std::string::npos) {
      // Found an escape char, must also find the closing one.
      size_t pos2 = s.find(escape_char_, pos + 1);
      // If placeholder not closed, ignore.
      if (pos2 == std::string::npos) break;
      auto it = vars.find(s.substr(pos + 1, pos2 - pos - 1));
      // If unknown placeholder, ignore.
      if (it == vars.end()) break;
      // Subtitute placeholder.
      s.replace(pos, pos2 - pos + 1, it->second);
    }
    Print(s.c_str());
  }